

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retArea.c
# Opt level: O0

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj_local;
  Abc_Ntk_t *pNtkNew_local;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pObj);
    iVar1 = Abc_ObjIsBi(pObj);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/ret/retArea.c"
                      ,0x157,
                      "Abc_Obj_t *Abc_NtkRetimeMinAreaConstructNtk_rec(Abc_Ntk_t *, Abc_Obj_t *)");
      }
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_2c);
        Abc_NtkRetimeMinAreaConstructNtk_rec(pNtkNew,pAVar2);
      }
      Abc_NtkDupObj(pNtkNew,pObj,0);
      for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
        pAVar2 = Abc_ObjFanin(pObj,local_2c);
        Abc_ObjAddFanin((pObj->field_6).pCopy,(pAVar2->field_6).pCopy);
      }
      pNtkNew_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
    }
    else {
      pAVar2 = Abc_ObjFanin0(pObj);
      pAVar2 = Abc_NtkRetimeMinAreaConstructNtk_rec(pNtkNew,pAVar2);
      (pObj->field_6).pCopy = pAVar2;
      pNtkNew_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
    }
  }
  else {
    pNtkNew_local = (Abc_Ntk_t *)(pObj->field_6).pCopy;
  }
  return (Abc_Obj_t *)pNtkNew_local;
}

Assistant:

Abc_Obj_t * Abc_NtkRetimeMinAreaConstructNtk_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i;
    // skip visited nodes
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return pObj->pCopy;
    Abc_NodeSetTravIdCurrent(pObj);
    // consider the case of a latch output
    if ( Abc_ObjIsBi(pObj) )
    {
        pObj->pCopy = Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, Abc_ObjFanin0(pObj) );
        return pObj->pCopy;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_NtkRetimeMinAreaConstructNtk_rec( pNtkNew, pFanin );
    // compute the value of the node
    Abc_NtkDupObj( pNtkNew, pObj, 0 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    return pObj->pCopy;
}